

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O2

void __thiscall asl::XdlEncoder::~XdlEncoder(XdlEncoder *this)

{
  if (this->_sink != (XdlSink *)0x0) {
    (*this->_sink->_vptr_XdlSink[1])();
  }
  String::~String(&this->_sep2);
  String::~String(&this->_sep1);
  String::~String(&this->_indent);
  String::~String(&this->_out);
  return;
}

Assistant:

XdlEncoder::~XdlEncoder()
{
	delete _sink;
}